

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtract.hpp
# Opt level: O2

unsigned_short
duckdb::DecimalSubtractOverflowCheck::Operation<unsigned_short,unsigned_short,unsigned_short>
          (unsigned_short left,unsigned_short right)

{
  bool bVar1;
  OutOfRangeException *this;
  unsigned_short result;
  allocator local_41;
  string local_40;
  
  bVar1 = TryDecimalSubtract::Operation<unsigned_short,unsigned_short,unsigned_short>
                    (left,right,&result);
  if (bVar1) {
    return result;
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_40,
             "Overflow in subtract of DECIMAL(18) (%d - %d). You might want to add an explicit cast to a bigger decimal."
             ,&local_41);
  OutOfRangeException::OutOfRangeException<unsigned_short,unsigned_short>(this,&local_40,left,right)
  ;
  __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline TR Operation(TA left, TB right) {
		TR result;
		if (!TryDecimalSubtract::Operation<TA, TB, TR>(left, right, result)) {
			throw OutOfRangeException("Overflow in subtract of DECIMAL(18) (%d - %d). You might want to add an "
			                          "explicit cast to a bigger decimal.",
			                          left, right);
		}
		return result;
	}